

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O1

int __thiscall sentencepiece::unigram::Model::PieceToId(Model *this,string_view piece)

{
  const_iterator cVar1;
  int id;
  int local_24;
  key_type local_20;
  
  local_20._M_str = piece._M_str;
  local_20._M_len = piece._M_len;
  cVar1 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->super_ModelInterface).reserved_id_map_._M_h,&local_20);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_24 = 0;
    Darts::DoubleArrayImpl<void,_void,_int,_void>::exactMatchSearch<int>
              ((this->trie_)._M_t.
               super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
               .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>.
               _M_head_impl,local_20._M_str,&local_24,local_20._M_len,0);
    if (local_24 == -1) {
      local_24 = (this->super_ModelInterface).unk_id_;
    }
  }
  else {
    local_24 = *(int *)((long)cVar1.
                              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                              ._M_cur + 0x18);
  }
  return local_24;
}

Assistant:

int Model::PieceToId(absl::string_view piece) const {
  auto it = reserved_id_map_.find(piece);
  if (it != reserved_id_map_.end()) {
    return it->second;
  }
  int id = 0;
  trie_->exactMatchSearch(piece.data(), id, piece.size());
  return id == -1 ? unk_id_ : id;
}